

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Iscatter(void *sendbuf,int sendcount,MPIABI_Datatype sendtype,void *recvbuf,int recvcount
                   ,MPIABI_Datatype recvtype,int root,MPIABI_Comm comm,MPIABI_Request *request)

{
  void *pvVar1;
  int iVar2;
  ompi_datatype_t *poVar3;
  ompi_datatype_t *poVar4;
  ompi_communicator_t *poVar5;
  ompi_request_t **ppoVar6;
  WPI_HandlePtr<ompi_request_t_*> local_60;
  WPI_Handle local_58 [8];
  WPI_Handle local_50 [8];
  WPI_Handle local_48 [8];
  MPIABI_Datatype local_40;
  MPIABI_Datatype recvtype_local;
  void *pvStack_30;
  int recvcount_local;
  void *recvbuf_local;
  MPIABI_Datatype sendtype_local;
  void *pvStack_18;
  int sendcount_local;
  void *sendbuf_local;
  
  local_40 = recvtype;
  recvtype_local._4_4_ = recvcount;
  pvStack_30 = recvbuf;
  recvbuf_local = (void *)sendtype;
  sendtype_local._4_4_ = sendcount;
  pvStack_18 = sendbuf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_48,sendtype);
  poVar3 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_48);
  pvVar1 = pvStack_30;
  iVar2 = recvtype_local._4_4_;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_50,local_40);
  poVar4 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_50);
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle((WPI_Handle<ompi_communicator_t_*> *)local_58,comm);
  poVar5 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_58);
  WPI_HandlePtr<ompi_request_t_*>::WPI_HandlePtr(&local_60,request);
  ppoVar6 = WPI_HandlePtr::operator_cast_to_ompi_request_t__((WPI_HandlePtr *)&local_60);
  iVar2 = MPI_Iscatter(sendbuf,sendcount,poVar3,pvVar1,iVar2,poVar4,root,poVar5,ppoVar6);
  WPI_HandlePtr<ompi_request_t_*>::~WPI_HandlePtr(&local_60);
  return iVar2;
}

Assistant:

int MPIABI_Iscatter(
  const void * sendbuf,
  int sendcount,
  MPIABI_Datatype sendtype,
  void * recvbuf,
  int recvcount,
  MPIABI_Datatype recvtype,
  int root,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Iscatter(
    sendbuf,
    sendcount,
    (MPI_Datatype)(WPI_Datatype)sendtype,
    recvbuf,
    recvcount,
    (MPI_Datatype)(WPI_Datatype)recvtype,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}